

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O3

void __thiscall
Diligent::anon_unknown_0::DXCompilerImpl::GetD3D12ShaderReflection
          (DXCompilerImpl *this,IDxcBlob *pShaderBytecode,
          ID3D12ShaderReflection **ppShaderReflection)

{
  return;
}

Assistant:

void DXCompilerImpl::GetD3D12ShaderReflection(IDxcBlob*                pShaderBytecode,
                                              ID3D12ShaderReflection** ppShaderReflection)
{
    // NOTE: a reference to pShaderBytecode may be kept in the returned object

#if D3D12_SUPPORTED
    try
    {
        DxcCreateInstanceProc CreateInstance = m_Library.GetDxcCreateInstance();
        if (CreateInstance == nullptr)
            return;

        CComPtr<IDxcContainerReflection> pdxcReflection;

        CHECK_D3D_RESULT(CreateInstance(CLSID_DxcContainerReflection, IID_PPV_ARGS(&pdxcReflection)), "Failed to create DXC shader reflection instance");
        CHECK_D3D_RESULT(pdxcReflection->Load(pShaderBytecode), "Failed to load shader reflection from bytecode");

        UINT32 shaderIdx = 0;
        CHECK_D3D_RESULT(pdxcReflection->FindFirstPartKind(DXC_PART_DXIL, &shaderIdx), "Failed to get the shader reflection");

        HRESULT hr = pdxcReflection->GetPartReflection(shaderIdx, IID_PPV_ARGS(ppShaderReflection));
        if (SUCCEEDED(hr))
            return;

        // Try to get the reflection via library reflection
        CComPtr<ID3D12LibraryReflection> pd3d12LibRefl;

        CHECK_D3D_RESULT(pdxcReflection->GetPartReflection(shaderIdx, IID_PPV_ARGS(&pd3d12LibRefl)), "Failed to get d3d12 library reflection part");
#    ifdef DILIGENT_DEVELOPMENT
        {
            D3D12_LIBRARY_DESC Desc = {};
            pd3d12LibRefl->GetDesc(&Desc);
            DEV_CHECK_ERR(Desc.FunctionCount == 1, "Single-function library is expected");
        }
#    endif

        if (ID3D12FunctionReflection* pFunc = pd3d12LibRefl->GetFunctionByIndex(0))
        {
            *ppShaderReflection = new ShaderReflectionViaLibraryReflection{std::move(pd3d12LibRefl), pFunc};
            (*ppShaderReflection)->AddRef();
        }
    }
    catch (...)
    {
    }
#endif // D3D12_SUPPORTED
}